

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.cpp
# Opt level: O3

ChainstateLoadResult *
node::CompleteChainstateInitialization
          (ChainstateLoadResult *__return_storage_ptr__,ChainstateManager *chainman,
          CacheSizes *cache_sizes,ChainstateLoadOptions *options)

{
  unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool should_wipe;
  CoinsViews *pCVar4;
  pointer ppCVar5;
  double dVar6;
  path leveldb_name;
  pointer ppCVar7;
  bool bVar8;
  CDBWrapper *this_00;
  CBlockIndex *pCVar9;
  Chainstate *pCVar10;
  unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *puVar11;
  CCoinsViewCache *pCVar12;
  uchar *puVar13;
  pointer __p;
  ulong uVar14;
  _Alloc_hider _Var15;
  long lVar16;
  long lVar17;
  pointer ppCVar18;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> chainstates;
  _Any_data local_150;
  code *local_140;
  bilingual_str local_130;
  path local_f0;
  bilingual_str local_c8;
  path local_88;
  path local_60;
  ChainstateLoadResult *local_38;
  
  local_38 = *(ChainstateLoadResult **)(in_FS_OFFSET + 0x28);
  this = &(chainman->m_blockman).m_block_tree_db;
  std::__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::reset
            ((__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)this
             ,(pointer)0x0);
  std::filesystem::__cxx11::path::path(&local_88,&(chainman->m_options).datadir.super_path);
  std::filesystem::__cxx11::path::_M_append(&local_88,6,"blocks");
  std::filesystem::__cxx11::path::path(&local_60,&local_88);
  std::filesystem::__cxx11::path::_M_append(&local_60,5,"index");
  std::filesystem::__cxx11::path::path((path *)&local_c8,&local_60);
  local_c8.translated._M_string_length = cache_sizes->block_tree_db;
  local_c8.translated.field_2._M_local_buf[0] = options->block_tree_db_in_memory;
  local_c8.translated.field_2._M_local_buf[1] = options->wipe_block_tree_db;
  local_c8.translated.field_2._M_local_buf[2] = '\0';
  local_c8.translated.field_2._M_local_buf[3] = (chainman->m_options).block_tree_db.force_compact;
  this_00 = (CDBWrapper *)operator_new(0x70);
  CDBWrapper::CDBWrapper(this_00,(DBParams *)&local_c8);
  local_130.original._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::reset
            ((__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)this
             ,(pointer)this_00);
  std::unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::~unique_ptr
            ((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
             &local_130);
  std::filesystem::__cxx11::path::~path((path *)&local_c8);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::filesystem::__cxx11::path::~path(&local_88);
  if (options->wipe_block_tree_db == true) {
    kernel::BlockTreeDB::WriteReindexing
              ((chainman->m_blockman).m_block_tree_db._M_t.
               super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
               ._M_t.
               super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
               .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,true);
    LOCK();
    (chainman->m_blockman).m_blockfiles_indexed._M_base._M_i = false;
    UNLOCK();
    if (options->prune == true) {
      BlockManager::CleanupBlockRevFiles(&chainman->m_blockman);
    }
  }
  bVar8 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
  if (bVar8) {
    local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
    local_c8.original._M_string_length = 0;
    local_c8.original.field_2._M_local_buf[0] = '\0';
    local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
    local_c8.translated._M_string_length = 0;
    local_c8.translated.field_2._M_local_buf[0] = '\0';
    std::_Head_base<1UL,_bilingual_str,_false>::_Head_base
              ((_Head_base<1UL,_bilingual_str,_false> *)__return_storage_ptr__,&local_c8);
LAB_00220476:
    (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
    super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = INTERRUPTED;
LAB_0022047f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.translated._M_dataplus._M_p != &local_c8.translated.field_2) {
      operator_delete(local_c8.translated._M_dataplus._M_p,
                      CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                        CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                                 CONCAT11(local_c8.translated.field_2._M_local_buf
                                                          [1],local_c8.translated.field_2.
                                                              _M_local_buf[0])))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.original._M_dataplus._M_p == &local_c8.original.field_2) goto LAB_00220d3e;
    uVar14 = CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]) + 1;
    _Var15._M_p = local_c8.original._M_dataplus._M_p;
  }
  else {
    bVar8 = ChainstateManager::LoadBlockIndex(chainman);
    if (!bVar8) {
      bVar8 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
      if (!bVar8) {
        paVar2 = &local_c8.original.field_2;
        local_c8.original._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"Error loading block database","");
        paVar3 = &local_c8.translated.field_2;
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_c8.translated._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8.translated,"Error loading block database","");
        }
        else {
          local_130.original._M_dataplus._M_p = "Error loading block database";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                     (char **)&local_130);
        }
        paVar1 = &(__return_storage_ptr__->
                  super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                  super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                  _M_head_impl.original.field_2;
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.original._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.original._M_dataplus._M_p == paVar2) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                        local_c8.original.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                   super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>
                   ._M_head_impl.original.field_2 + 8) = local_c8.original.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.original._M_dataplus._M_p = local_c8.original._M_dataplus._M_p;
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.original.field_2._M_allocated_capacity =
               CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                        local_c8.original.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.original._M_string_length = local_c8.original._M_string_length;
        paVar2 = &(__return_storage_ptr__->
                  super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                  super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                  _M_head_impl.translated.field_2;
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.translated._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.translated._M_dataplus._M_p == paVar3) {
          paVar2->_M_allocated_capacity =
               CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                        CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                 CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                          CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                   local_c8.translated.field_2._M_local_buf[0]))));
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                   super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>
                   ._M_head_impl.translated.field_2 + 8) = local_c8.translated.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.translated._M_dataplus._M_p = local_c8.translated._M_dataplus._M_p;
LAB_00220d1b:
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.translated.field_2._M_allocated_capacity =
               CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                        CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                 CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                          CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                   local_c8.translated.field_2._M_local_buf[0]))));
        }
LAB_00220d28:
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.translated._M_string_length = local_c8.translated._M_string_length;
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = FAILURE;
        goto LAB_00220d3e;
      }
      local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
      local_c8.original._M_string_length = 0;
      local_c8.original.field_2._M_local_buf[0] = '\0';
      local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
      local_c8.translated._M_string_length = 0;
      local_c8.translated.field_2._M_local_buf[0] = '\0';
      std::_Head_base<1UL,_bilingual_str,_false>::_Head_base
                ((_Head_base<1UL,_bilingual_str,_false> *)__return_storage_ptr__,&local_c8);
      goto LAB_00220476;
    }
    if (((chainman->m_blockman).m_block_index._M_h._M_element_count != 0) &&
       (pCVar9 = BlockManager::LookupBlockIndex
                           (&chainman->m_blockman,(uint256 *)(chainman->m_options).chainparams),
       pCVar9 == (CBlockIndex *)0x0)) {
      paVar2 = &local_c8.original.field_2;
      local_c8.original._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,
                 "Incorrect or no genesis block found. Wrong datadir for network?","");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8.translated,
                   "Incorrect or no genesis block found. Wrong datadir for network?","");
      }
      else {
        local_130.original._M_dataplus._M_p =
             "Incorrect or no genesis block found. Wrong datadir for network?";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                   (char **)&local_130);
      }
      paVar3 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.original.field_2;
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original._M_dataplus._M_p = (pointer)paVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.original._M_dataplus._M_p == paVar2) {
        paVar3->_M_allocated_capacity =
             CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                 super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                 _M_head_impl.original.field_2 + 8) = local_c8.original.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.original._M_dataplus._M_p = local_c8.original._M_dataplus._M_p;
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.original.field_2._M_allocated_capacity =
             CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]);
      }
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original._M_string_length = local_c8.original._M_string_length;
      paVar2 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.translated.field_2;
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .translated._M_dataplus._M_p = (pointer)paVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.translated._M_dataplus._M_p == &local_c8.translated.field_2) {
        paVar2->_M_allocated_capacity =
             CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                      CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                               CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                        CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                 local_c8.translated.field_2._M_local_buf[0]))));
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                 super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                 _M_head_impl.translated.field_2 + 8) = local_c8.translated.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.translated._M_dataplus._M_p = local_c8.translated._M_dataplus._M_p;
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.translated.field_2._M_allocated_capacity =
             CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                      CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                               CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                        CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                 local_c8.translated.field_2._M_local_buf[0]))));
      }
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .translated._M_string_length = local_c8.translated._M_string_length;
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl =
           FAILURE_INCOMPATIBLE_DB;
      goto LAB_00220d3e;
    }
    if (((chainman->m_blockman).m_have_pruned == true) && (options->prune == false)) {
      local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,
                 "You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain"
                 ,"");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8.translated,
                   "You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain"
                   ,"");
      }
      else {
        local_130.original._M_dataplus._M_p =
             "You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain"
        ;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                   (char **)&local_130);
      }
LAB_00220cc0:
      paVar2 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.original.field_2;
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original._M_dataplus._M_p = (pointer)paVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.original._M_dataplus._M_p == &local_c8.original.field_2) {
        paVar2->_M_allocated_capacity =
             CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                 super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                 _M_head_impl.original.field_2 + 8) = local_c8.original.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.original._M_dataplus._M_p = local_c8.original._M_dataplus._M_p;
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.original.field_2._M_allocated_capacity =
             CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]);
      }
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original._M_string_length = local_c8.original._M_string_length;
      paVar2 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.translated.field_2;
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .translated._M_dataplus._M_p = (pointer)paVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.translated._M_dataplus._M_p != &local_c8.translated.field_2) {
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.translated._M_dataplus._M_p = local_c8.translated._M_dataplus._M_p;
        goto LAB_00220d1b;
      }
      paVar2->_M_allocated_capacity =
           CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                    CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                             CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                      CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                               local_c8.translated.field_2._M_local_buf[0]))));
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
               super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
               _M_head_impl.translated.field_2 + 8) = local_c8.translated.field_2._8_8_;
      goto LAB_00220d28;
    }
    if (((chainman->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) != 0) {
      pCVar10 = ChainstateManager::ActiveChainstate(chainman);
      bVar8 = Chainstate::LoadGenesisBlock(pCVar10);
      if (!bVar8) {
        local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"Error initializing block database","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8.translated,"Error initializing block database","");
        }
        else {
          local_130.original._M_dataplus._M_p = "Error initializing block database";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                     (char **)&local_130);
        }
        goto LAB_00220cc0;
      }
    }
    if (chainman->m_total_coinstip_cache < 1) {
      __assert_fail("chainman.m_total_coinstip_cache > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                    ,0x5f,
                    "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                   );
    }
    if (chainman->m_total_coinsdb_cache < 1) {
      __assert_fail("chainman.m_total_coinsdb_cache > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                    ,0x60,
                    "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                   );
    }
    ChainstateManager::GetAll
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_130,chainman);
    if (local_130.original._M_dataplus._M_p != (pointer)local_130.original._M_string_length) {
      _Var15._M_p = local_130.original._M_dataplus._M_p;
      do {
        pCVar10 = *(Chainstate **)_Var15._M_p;
        Chainstate::ToString_abi_cxx11_(&local_c8.original,pCVar10);
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
        ;
        source_file._M_len = 99;
        logging_function._M_str = "CompleteChainstateInitialization";
        logging_function._M_len = 0x20;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function,source_file,0x6c,ALL,Info,(ConstevalFormatString<1U>)0x7d8961,
                   &local_c8.original);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.original._M_dataplus._M_p != &local_c8.original.field_2) {
          operator_delete(local_c8.original._M_dataplus._M_p,
                          CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                                   local_c8.original.field_2._M_local_buf[0]) + 1);
        }
        lVar16 = chainman->m_total_coinsdb_cache;
        bVar8 = options->coins_db_in_memory;
        should_wipe = options->wipe_chainstate_db;
        local_c8.original._M_dataplus._M_p = "chainstate";
        std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                  (&local_f0,(char **)&local_c8,auto_format);
        dVar6 = (double)lVar16 * 0.2;
        uVar14 = (ulong)dVar6;
        leveldb_name.super_path._M_pathname._M_string_length = (size_type)chainman;
        leveldb_name.super_path._M_pathname._M_dataplus._M_p = (pointer)__return_storage_ptr__;
        leveldb_name.super_path._M_pathname.field_2._M_allocated_capacity =
             (size_type)&options->coins_error_cb;
        leveldb_name.super_path._M_pathname.field_2._8_8_ = local_130.original._M_string_length;
        leveldb_name.super_path._M_cmpts._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
             (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                )chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
        Chainstate::InitCoinsDB
                  (pCVar10,(long)(dVar6 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14,
                   bVar8,should_wipe,leveldb_name);
        std::filesystem::__cxx11::path::~path(&local_f0);
        if ((options->coins_error_cb).super__Function_base._M_manager != (_Manager_type)0x0) {
          puVar11 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                              (&pCVar10->m_coins_views,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                               ,0x27f,"CoinsErrorCatcher","m_coins_views");
          pCVar4 = (puVar11->_M_t).
                   super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
                   super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                   super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
          std::function<void_()>::function((function<void_()> *)&local_150,&options->coins_error_cb)
          ;
          std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
          emplace_back<std::function<void()>>
                    ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)
                     &(pCVar4->m_catcherview).m_err_callbacks,(function<void_()> *)&local_150);
          if (local_140 != (code *)0x0) {
            (*local_140)(&local_150,&local_150,__destroy_functor);
          }
        }
        puVar11 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                            (&pCVar10->m_coins_views,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                             ,0x271,"CoinsDB","m_coins_views");
        bVar8 = CCoinsViewDB::NeedsUpgrade
                          (&((puVar11->_M_t).
                             super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                             super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl)->m_dbview);
        if (bVar8) {
          paVar2 = &local_c8.original.field_2;
          local_c8.original._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,
                     "Unsupported chainstate database format found. Please restart with -reindex-chainstate. This will rebuild the chainstate database."
                     ,"");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8.translated,
                       "Unsupported chainstate database format found. Please restart with -reindex-chainstate. This will rebuild the chainstate database."
                       ,"");
          }
          else {
            chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_45a710;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                       (char **)&chainstates);
          }
          paVar3 = &(__return_storage_ptr__->
                    super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                    super__Tuple_impl<1UL,_bilingual_str>.
                    super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2;
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.original._M_dataplus._M_p = (pointer)paVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.original._M_dataplus._M_p == paVar2) {
            paVar3->_M_allocated_capacity =
                 CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                          local_c8.original.field_2._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                     super__Tuple_impl<1UL,_bilingual_str>.
                     super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2 + 8)
                 = local_c8.original.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.original._M_dataplus._M_p = local_c8.original._M_dataplus._M_p;
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.original.field_2._M_allocated_capacity =
                 CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                          local_c8.original.field_2._M_local_buf[0]);
          }
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.original._M_string_length = local_c8.original._M_string_length;
          local_c8.original._M_string_length = 0;
          local_c8.original.field_2._M_local_buf[0] = '\0';
          paVar3 = &(__return_storage_ptr__->
                    super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                    super__Tuple_impl<1UL,_bilingual_str>.
                    super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2;
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.translated._M_dataplus._M_p = (pointer)paVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.translated._M_dataplus._M_p == &local_c8.translated.field_2) {
            paVar3->_M_allocated_capacity =
                 CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                          CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                   CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                            CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                     local_c8.translated.field_2._M_local_buf[0]))))
            ;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                     super__Tuple_impl<1UL,_bilingual_str>.
                     super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2 + 8
             ) = local_c8.translated.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.translated._M_dataplus._M_p = local_c8.translated._M_dataplus._M_p;
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.translated.field_2._M_allocated_capacity =
                 CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                          CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                   CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                            CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                     local_c8.translated.field_2._M_local_buf[0]))))
            ;
          }
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.translated._M_string_length = local_c8.translated._M_string_length;
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl =
               FAILURE_INCOMPATIBLE_DB;
          local_c8.original._M_dataplus._M_p = (pointer)paVar2;
LAB_0022114a:
          _Var15._M_p = local_130.original._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130.original._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) goto LAB_0022115d;
          goto LAB_00220d3e;
        }
        bVar8 = Chainstate::ReplayBlocks(pCVar10);
        if (!bVar8) {
          paVar2 = &local_c8.original.field_2;
          local_c8.original._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,
                     "Unable to replay blocks. You will need to rebuild the database using -reindex-chainstate."
                     ,"");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8.translated,
                       "Unable to replay blocks. You will need to rebuild the database using -reindex-chainstate."
                       ,"");
          }
          else {
            chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_45a729;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_c8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                       (char **)&chainstates);
          }
          paVar3 = &(__return_storage_ptr__->
                    super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                    super__Tuple_impl<1UL,_bilingual_str>.
                    super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2;
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.original._M_dataplus._M_p = (pointer)paVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.original._M_dataplus._M_p == paVar2) {
            paVar3->_M_allocated_capacity =
                 CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                          local_c8.original.field_2._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                     super__Tuple_impl<1UL,_bilingual_str>.
                     super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2 + 8)
                 = local_c8.original.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.original._M_dataplus._M_p = local_c8.original._M_dataplus._M_p;
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.original.field_2._M_allocated_capacity =
                 CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                          local_c8.original.field_2._M_local_buf[0]);
          }
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.original._M_string_length = local_c8.original._M_string_length;
          local_c8.original._M_string_length = 0;
          local_c8.original.field_2._M_local_buf[0] = '\0';
          paVar3 = &(__return_storage_ptr__->
                    super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                    super__Tuple_impl<1UL,_bilingual_str>.
                    super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2;
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.translated._M_dataplus._M_p = (pointer)paVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.translated._M_dataplus._M_p == &local_c8.translated.field_2) {
            paVar3->_M_allocated_capacity =
                 CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                          CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                   CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                            CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                     local_c8.translated.field_2._M_local_buf[0]))))
            ;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                     super__Tuple_impl<1UL,_bilingual_str>.
                     super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2 + 8
             ) = local_c8.translated.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.translated._M_dataplus._M_p = local_c8.translated._M_dataplus._M_p;
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.translated.field_2._M_allocated_capacity =
                 CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                          CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                   CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                            CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                                     local_c8.translated.field_2._M_local_buf[0]))))
            ;
          }
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.translated._M_string_length = local_c8.translated._M_string_length;
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = FAILURE;
          local_c8.original._M_dataplus._M_p = (pointer)paVar2;
          goto LAB_0022114a;
        }
        dVar6 = (double)chainman->m_total_coinstip_cache * 0.2;
        uVar14 = (ulong)dVar6;
        Chainstate::InitCoinsCache
                  (pCVar10,(long)(dVar6 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14);
        pCVar4 = (pCVar10->m_coins_views)._M_t.
                 super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
                 super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                 super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
        if ((pCVar4 == (CoinsViews *)0x0) ||
           ((_Head_base<0UL,_CCoinsViewCache_*,_false>)
            *(_Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_> *)
             &(pCVar4->m_cacheview)._M_t.
              super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> ==
            (CCoinsViewCache *)0x0)) {
          __assert_fail("chainstate->CanFlushToDisk()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                        ,0x86,
                        "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                       );
        }
        if (options->wipe_chainstate_db != true) {
          pCVar12 = Chainstate::CoinsTip(pCVar10);
          (*(pCVar12->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])
                    (&local_c8,pCVar12);
          puVar13 = std::
                    __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                              (&local_c8,&local_c8.translated);
          if ((string *)puVar13 != &local_c8.translated) {
            bVar8 = Chainstate::LoadChainTip(pCVar10);
            if (!bVar8) {
              _(&local_c8,(ConstevalStringLiteral)0x7d8853);
              paVar2 = &(__return_storage_ptr__->
                        super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                        super__Tuple_impl<1UL,_bilingual_str>.
                        super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2;
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.original._M_dataplus._M_p = (pointer)paVar2;
              paVar3 = &local_c8.original.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8.original._M_dataplus._M_p == paVar3) {
                paVar2->_M_allocated_capacity =
                     CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                              local_c8.original.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                         super__Tuple_impl<1UL,_bilingual_str>.
                         super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2 +
                 8) = local_c8.original.field_2._8_8_;
              }
              else {
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.original._M_dataplus._M_p = local_c8.original._M_dataplus._M_p;
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.original.field_2._M_allocated_capacity =
                     CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                              local_c8.original.field_2._M_local_buf[0]);
              }
              paVar1 = &local_c8.translated.field_2;
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.original._M_string_length = local_c8.original._M_string_length;
              local_c8.original._M_string_length = 0;
              local_c8.original.field_2._M_local_buf[0] = '\0';
              paVar2 = &(__return_storage_ptr__->
                        super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                        super__Tuple_impl<1UL,_bilingual_str>.
                        super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2;
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.translated._M_dataplus._M_p = (pointer)paVar2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8.translated._M_dataplus._M_p == paVar1) {
                paVar2->_M_allocated_capacity =
                     CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                              CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                       CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                                CONCAT11(local_c8.translated.field_2._M_local_buf[1]
                                                         ,local_c8.translated.field_2._M_local_buf
                                                          [0]))));
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                         super__Tuple_impl<1UL,_bilingual_str>.
                         super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2
                 + 8) = local_c8.translated.field_2._8_8_;
              }
              else {
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.translated._M_dataplus._M_p = local_c8.translated._M_dataplus._M_p;
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.translated.field_2._M_allocated_capacity =
                     CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                              CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                                       CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                                CONCAT11(local_c8.translated.field_2._M_local_buf[1]
                                                         ,local_c8.translated.field_2._M_local_buf
                                                          [0]))));
              }
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.translated._M_string_length = local_c8.translated._M_string_length;
              local_c8.translated._M_string_length = 0;
              local_c8.translated.field_2._M_local_buf[0] = '\0';
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = FAILURE;
              local_c8.original._M_dataplus._M_p = (pointer)paVar3;
              local_c8.translated._M_dataplus._M_p = (pointer)paVar1;
              bilingual_str::~bilingual_str(&local_c8);
              goto LAB_0022114a;
            }
            ppCVar5 = (pCVar10->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if ((ppCVar5 ==
                 (pCVar10->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_start) || (ppCVar5[-1] == (CBlockIndex *)0x0)) {
              __assert_fail("chainstate->m_chain.Tip() != nullptr",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                            ,0x8d,
                            "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                           );
            }
          }
        }
        _Var15._M_p = _Var15._M_p + 8;
      } while (_Var15._M_p != (pointer)local_130.original._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.original._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_130.original._M_dataplus._M_p,
                      local_130.original.field_2._M_allocated_capacity -
                      (long)local_130.original._M_dataplus._M_p);
    }
    if (options->wipe_block_tree_db != false) {
LAB_00220fd5:
      ChainstateManager::MaybeRebalanceCaches(chainman);
      local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
      local_c8.original._M_string_length = 0;
      local_c8.original.field_2._M_local_buf[0] = '\0';
      local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
      local_c8.translated._M_string_length = 0;
      local_c8.translated.field_2._M_local_buf[0] = '\0';
      std::_Head_base<1UL,_bilingual_str,_false>::_Head_base
                ((_Head_base<1UL,_bilingual_str,_false> *)__return_storage_ptr__,&local_c8);
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = SUCCESS;
      goto LAB_0022047f;
    }
    ChainstateManager::GetAll(&chainstates,chainman);
    lVar16 = (long)chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    ppCVar18 = chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (0 < lVar16 >> 5) {
      lVar17 = (lVar16 >> 5) + 1;
      ppCVar7 = chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_start + 2;
      do {
        ppCVar18 = ppCVar7;
        bVar8 = Chainstate::NeedsRedownload(ppCVar18[-2]);
        if (bVar8) {
          ppCVar18 = ppCVar18 + -2;
          goto LAB_00220f5d;
        }
        bVar8 = Chainstate::NeedsRedownload(ppCVar18[-1]);
        if (bVar8) {
          ppCVar18 = ppCVar18 + -1;
          goto LAB_00220f5d;
        }
        bVar8 = Chainstate::NeedsRedownload(*ppCVar18);
        if (bVar8) goto LAB_00220f5d;
        bVar8 = Chainstate::NeedsRedownload(ppCVar18[1]);
        if (bVar8) {
          ppCVar18 = ppCVar18 + 1;
          goto LAB_00220f5d;
        }
        lVar17 = lVar17 + -1;
        lVar16 = lVar16 + -0x20;
        ppCVar7 = ppCVar18 + 4;
      } while (1 < lVar17);
      ppCVar18 = ppCVar18 + 2;
    }
    lVar16 = lVar16 >> 3;
    if (lVar16 != 1) {
      if (lVar16 == 2) {
LAB_00220f2f:
        bVar8 = Chainstate::NeedsRedownload(*ppCVar18);
        if (!bVar8) {
          ppCVar18 = ppCVar18 + 1;
          goto LAB_00220f45;
        }
        goto LAB_00220f5d;
      }
      if (lVar16 == 3) {
        bVar8 = Chainstate::NeedsRedownload(*ppCVar18);
        if (!bVar8) {
          ppCVar18 = ppCVar18 + 1;
          goto LAB_00220f2f;
        }
        goto LAB_00220f5d;
      }
LAB_00220fbe:
      if (chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)chainstates.
                              super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)chainstates.
                              super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00220fd5;
    }
LAB_00220f45:
    bVar8 = Chainstate::NeedsRedownload(*ppCVar18);
    if (!bVar8) {
      ppCVar18 = chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                 .super__Vector_impl_data._M_finish;
    }
LAB_00220f5d:
    if (ppCVar18 ==
        chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00220fbe;
    _(&local_130,(ConstevalStringLiteral)0x7d8a9b);
    tinyformat::format<int>
              (&local_c8,&local_130,&(((chainman->m_options).chainparams)->consensus).SegwitHeight);
    paVar2 = &(__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.original.field_2;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
    super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.
    original._M_dataplus._M_p = (pointer)paVar2;
    paVar3 = &local_c8.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.original._M_dataplus._M_p == paVar3) {
      paVar2->_M_allocated_capacity =
           CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                    local_c8.original.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
               super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
               _M_head_impl.original.field_2 + 8) = local_c8.original.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original._M_dataplus._M_p = local_c8.original._M_dataplus._M_p;
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original.field_2._M_allocated_capacity =
           CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                    local_c8.original.field_2._M_local_buf[0]);
    }
    paVar1 = &local_c8.translated.field_2;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
    super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.
    original._M_string_length = local_c8.original._M_string_length;
    local_c8.original._M_string_length = 0;
    local_c8.original.field_2._M_local_buf[0] = '\0';
    paVar2 = &(__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.translated.field_2;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
    super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.
    translated._M_dataplus._M_p = (pointer)paVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.translated._M_dataplus._M_p == paVar1) {
      paVar2->_M_allocated_capacity =
           CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                    CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                             CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                      CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                               local_c8.translated.field_2._M_local_buf[0]))));
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
               super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
               _M_head_impl.translated.field_2 + 8) = local_c8.translated.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .translated._M_dataplus._M_p = local_c8.translated._M_dataplus._M_p;
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .translated.field_2._M_allocated_capacity =
           CONCAT44(local_c8.translated.field_2._M_allocated_capacity._4_4_,
                    CONCAT13(local_c8.translated.field_2._M_local_buf[3],
                             CONCAT12(local_c8.translated.field_2._M_local_buf[2],
                                      CONCAT11(local_c8.translated.field_2._M_local_buf[1],
                                               local_c8.translated.field_2._M_local_buf[0]))));
    }
    (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
    super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.
    translated._M_string_length = local_c8.translated._M_string_length;
    local_c8.translated._M_string_length = 0;
    local_c8.translated.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
    super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = FAILURE;
    local_c8.original._M_dataplus._M_p = (pointer)paVar3;
    local_c8.translated._M_dataplus._M_p = (pointer)paVar1;
    bilingual_str::~bilingual_str(&local_c8);
    bilingual_str::~bilingual_str(&local_130);
    local_130.original.field_2._M_allocated_capacity =
         (size_type)
         chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    _Var15._M_p = (pointer)chainstates.
                           super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                           super__Vector_impl_data._M_start;
    if (chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00220d3e;
LAB_0022115d:
    uVar14 = local_130.original.field_2._M_allocated_capacity - (long)_Var15._M_p;
  }
  operator_delete(_Var15._M_p,uVar14);
LAB_00220d3e:
  if (*(ChainstateLoadResult **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(ChainstateLoadResult **)(in_FS_OFFSET + 0x28);
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    auto& pblocktree{chainman.m_blockman.m_block_tree_db};
    // new BlockTreeDB tries to delete the existing file, which
    // fails if it's still open from the previous loop. Close it first:
    pblocktree.reset();
    pblocktree = std::make_unique<BlockTreeDB>(DBParams{
        .path = chainman.m_options.datadir / "blocks" / "index",
        .cache_bytes = static_cast<size_t>(cache_sizes.block_tree_db),
        .memory_only = options.block_tree_db_in_memory,
        .wipe_data = options.wipe_block_tree_db,
        .options = chainman.m_options.block_tree_db});

    if (options.wipe_block_tree_db) {
        pblocktree->WriteReindexing(true);
        chainman.m_blockman.m_blockfiles_indexed = false;
        //If we're reindexing in prune mode, wipe away unusable block files and all undo data files
        if (options.prune) {
            chainman.m_blockman.CleanupBlockRevFiles();
        }
    }

    if (chainman.m_interrupt) return {ChainstateLoadStatus::INTERRUPTED, {}};

    // LoadBlockIndex will load m_have_pruned if we've ever removed a
    // block file from disk.
    // Note that it also sets m_blockfiles_indexed based on the disk flag!
    if (!chainman.LoadBlockIndex()) {
        if (chainman.m_interrupt) return {ChainstateLoadStatus::INTERRUPTED, {}};
        return {ChainstateLoadStatus::FAILURE, _("Error loading block database")};
    }

    if (!chainman.BlockIndex().empty() &&
            !chainman.m_blockman.LookupBlockIndex(chainman.GetConsensus().hashGenesisBlock)) {
        // If the loaded chain has a wrong genesis, bail out immediately
        // (we're likely using a testnet datadir, or the other way around).
        return {ChainstateLoadStatus::FAILURE_INCOMPATIBLE_DB, _("Incorrect or no genesis block found. Wrong datadir for network?")};
    }

    // Check for changed -prune state.  What we are concerned about is a user who has pruned blocks
    // in the past, but is now trying to run unpruned.
    if (chainman.m_blockman.m_have_pruned && !options.prune) {
        return {ChainstateLoadStatus::FAILURE, _("You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain")};
    }

    // At this point blocktree args are consistent with what's on disk.
    // If we're not mid-reindex (based on disk + args), add a genesis block on disk
    // (otherwise we use the one already on disk).
    // This is called again in ImportBlocks after the reindex completes.
    if (chainman.m_blockman.m_blockfiles_indexed && !chainman.ActiveChainstate().LoadGenesisBlock()) {
        return {ChainstateLoadStatus::FAILURE, _("Error initializing block database")};
    }

    auto is_coinsview_empty = [&](Chainstate* chainstate) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        return options.wipe_chainstate_db || chainstate->CoinsTip().GetBestBlock().IsNull();
    };

    assert(chainman.m_total_coinstip_cache > 0);
    assert(chainman.m_total_coinsdb_cache > 0);

    // Conservative value which is arbitrarily chosen, as it will ultimately be changed
    // by a call to `chainman.MaybeRebalanceCaches()`. We just need to make sure
    // that the sum of the two caches (40%) does not exceed the allowable amount
    // during this temporary initialization state.
    double init_cache_fraction = 0.2;

    // At this point we're either in reindex or we've loaded a useful
    // block tree into BlockIndex()!

    for (Chainstate* chainstate : chainman.GetAll()) {
        LogPrintf("Initializing chainstate %s\n", chainstate->ToString());

        chainstate->InitCoinsDB(
            /*cache_size_bytes=*/chainman.m_total_coinsdb_cache * init_cache_fraction,
            /*in_memory=*/options.coins_db_in_memory,
            /*should_wipe=*/options.wipe_chainstate_db);

        if (options.coins_error_cb) {
            chainstate->CoinsErrorCatcher().AddReadErrCallback(options.coins_error_cb);
        }

        // Refuse to load unsupported database format.
        // This is a no-op if we cleared the coinsviewdb with -reindex or -reindex-chainstate
        if (chainstate->CoinsDB().NeedsUpgrade()) {
            return {ChainstateLoadStatus::FAILURE_INCOMPATIBLE_DB, _("Unsupported chainstate database format found. "
                                                                     "Please restart with -reindex-chainstate. This will "
                                                                     "rebuild the chainstate database.")};
        }

        // ReplayBlocks is a no-op if we cleared the coinsviewdb with -reindex or -reindex-chainstate
        if (!chainstate->ReplayBlocks()) {
            return {ChainstateLoadStatus::FAILURE, _("Unable to replay blocks. You will need to rebuild the database using -reindex-chainstate.")};
        }

        // The on-disk coinsdb is now in a good state, create the cache
        chainstate->InitCoinsCache(chainman.m_total_coinstip_cache * init_cache_fraction);
        assert(chainstate->CanFlushToDisk());

        if (!is_coinsview_empty(chainstate)) {
            // LoadChainTip initializes the chain based on CoinsTip()'s best block
            if (!chainstate->LoadChainTip()) {
                return {ChainstateLoadStatus::FAILURE, _("Error initializing block database")};
            }
            assert(chainstate->m_chain.Tip() != nullptr);
        }
    }

    if (!options.wipe_block_tree_db) {
        auto chainstates{chainman.GetAll()};
        if (std::any_of(chainstates.begin(), chainstates.end(),
                        [](const Chainstate* cs) EXCLUSIVE_LOCKS_REQUIRED(cs_main) { return cs->NeedsRedownload(); })) {
            return {ChainstateLoadStatus::FAILURE, strprintf(_("Witness data for blocks after height %d requires validation. Please restart with -reindex."),
                                                             chainman.GetConsensus().SegwitHeight)};
        };
    }

    // Now that chainstates are loaded and we're able to flush to
    // disk, rebalance the coins caches to desired levels based
    // on the condition of each chainstate.
    chainman.MaybeRebalanceCaches();

    return {ChainstateLoadStatus::SUCCESS, {}};
}